

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

char __thiscall Fl_Help_View::begin_selection(Fl_Help_View *this)

{
  Window WVar1;
  Fl_Surface_Device *pFVar2;
  Fl_Display_Device *pFVar3;
  Fl_Surface_Device *_ss;
  Window _sw;
  Fl_Help_View *this_local;
  
  clear_global_selection(this);
  if (fl_help_view_buffer == 0) {
    fl_help_view_buffer =
         XCreatePixmap(fl_display,
                       *(undefined8 *)(*(long *)(fl_display + 0xe8) + (long)fl_screen * 0x80 + 0x10)
                       ,1,1,fl_visual->depth);
  }
  mouse_x = Fl::event_x();
  mouse_y = Fl::event_y();
  WVar1 = fl_window;
  draw_mode = 1;
  fl_window = fl_help_view_buffer;
  current_view = this;
  pFVar2 = Fl_Surface_Device::surface();
  pFVar3 = Fl_Display_Device::display_device();
  (*(pFVar3->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])();
  fl_push_no_clip();
  (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[2])();
  fl_pop_clip();
  fl_window = WVar1;
  (*(pFVar2->super_Fl_Device)._vptr_Fl_Device[3])();
  draw_mode = 0;
  return selection_push_last != 0;
}

Assistant:

char Fl_Help_View::begin_selection()
{
  clear_global_selection();

  if (!fl_help_view_buffer) fl_help_view_buffer = fl_create_offscreen(1, 1);

  mouse_x = Fl::event_x();
  mouse_y = Fl::event_y();
  draw_mode = 1;

    current_view = this;
    fl_begin_offscreen(fl_help_view_buffer);
    draw();
    fl_end_offscreen();

  draw_mode = 0;

  if (selection_push_last) return 1;
  else return 0;
}